

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.h
# Opt level: O2

EventLogEntry * __thiscall
TTD::TTEventList::GetNextAvailableEntry<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<3ul>>
          (TTEventList *this)

{
  TTEventListLink *pTVar1;
  size_t sVar2;
  
  pTVar1 = this->m_headBlock;
  if ((pTVar1 == (TTEventListLink *)0x0) ||
     (sVar2 = pTVar1->CurrPos, sVar2 - 0xffd0 < 0xffffffffffff0000)) {
    AddArrayLink(this);
    pTVar1 = this->m_headBlock;
    sVar2 = pTVar1->CurrPos;
  }
  pTVar1->CurrPos = sVar2 + 0x30;
  return (EventLogEntry *)(pTVar1->BlockData + sVar2);
}

Assistant:

NSLogEvents::EventLogEntry* GetNextAvailableEntry() 
        {
            const size_t esize = TTD_EVENT_PLUS_DATA_SIZE(T);
            if((this->m_headBlock == nullptr) || (this->m_headBlock->CurrPos + esize >= TTD_EVENTLOG_LIST_BLOCK_SIZE))
            {
                this->AddArrayLink();
            }

            NSLogEvents::EventLogEntry* entry = reinterpret_cast<NSLogEvents::EventLogEntry*>(this->m_headBlock->BlockData + this->m_headBlock->CurrPos);
            this->m_headBlock->CurrPos += esize;

            return entry;
        }